

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAPI.c
# Opt level: O0

int Cudd_AddHook(DdManager *dd,DD_HFP f,Cudd_HookType where)

{
  DD_HFP p_Var1;
  DdHook *newHook;
  DdHook *nextHook;
  DdHook **hook;
  Cudd_HookType where_local;
  DD_HFP f_local;
  DdManager *dd_local;
  
  switch(where) {
  case CUDD_PRE_GC_HOOK:
    nextHook = (DdHook *)&dd->preGCHook;
    break;
  case CUDD_POST_GC_HOOK:
    nextHook = (DdHook *)&dd->postGCHook;
    break;
  case CUDD_PRE_REORDERING_HOOK:
    nextHook = (DdHook *)&dd->preReorderingHook;
    break;
  case CUDD_POST_REORDERING_HOOK:
    nextHook = (DdHook *)&dd->postReorderingHook;
    break;
  default:
    return 0;
  }
  newHook = (DdHook *)nextHook->f;
  while( true ) {
    if (newHook == (DdHook *)0x0) {
      p_Var1 = (DD_HFP)malloc(0x10);
      if (p_Var1 != (DD_HFP)0x0) {
        *(undefined8 *)(p_Var1 + 8) = 0;
        *(DD_HFP *)p_Var1 = f;
        nextHook->f = p_Var1;
      }
      else {
        dd->errorCode = CUDD_MEMORY_OUT;
      }
      dd_local._4_4_ = (uint)(p_Var1 != (DD_HFP)0x0);
      return dd_local._4_4_;
    }
    if (newHook->f == f) break;
    nextHook = (DdHook *)&newHook->next;
    newHook = newHook->next;
  }
  return 2;
}

Assistant:

int
Cudd_AddHook(
  DdManager * dd,
  DD_HFP f,
  Cudd_HookType where)
{
    DdHook **hook, *nextHook, *newHook;

    switch (where) {
    case CUDD_PRE_GC_HOOK:
        hook = &(dd->preGCHook);
        break;
    case CUDD_POST_GC_HOOK:
        hook = &(dd->postGCHook);
        break;
    case CUDD_PRE_REORDERING_HOOK:
        hook = &(dd->preReorderingHook);
        break;
    case CUDD_POST_REORDERING_HOOK:
        hook = &(dd->postReorderingHook);
        break;
    default:
        return(0);
    }
    /* Scan the list and find whether the function is already there.
    ** If so, just return. */
    nextHook = *hook;
    while (nextHook != NULL) {
        if (nextHook->f == f) {
            return(2);
        }
        hook = &(nextHook->next);
        nextHook = nextHook->next;
    }
    /* The function was not in the list. Create a new item and append it
    ** to the end of the list. */
    newHook = ABC_ALLOC(DdHook,1);
    if (newHook == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }
    newHook->next = NULL;
    newHook->f = f;
    *hook = newHook;
    return(1);

}